

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

void greetable_skeleton_init(GreetableSkeleton *skeleton)

{
  long lVar1;
  GMainContext *pGVar2;
  GValue *pGVar3;
  
  lVar1 = (long)GreetableSkeleton_private_offset;
  skeleton->priv =
       (GreetableSkeletonPrivate *)
       ((long)&(skeleton->parent_instance).parent_instance.g_type_instance.g_class + lVar1);
  g_mutex_init((long)&skeleton->priv + lVar1);
  pGVar2 = (GMainContext *)g_main_context_ref_thread_default();
  skeleton->priv->context = pGVar2;
  pGVar3 = (GValue *)g_malloc0(0x18);
  skeleton->priv->properties = pGVar3;
  g_value_init(pGVar3,0x40);
  return;
}

Assistant:

static void
greetable_skeleton_init (GreetableSkeleton *skeleton)
{
#if GLIB_VERSION_MAX_ALLOWED >= GLIB_VERSION_2_38
  skeleton->priv = greetable_skeleton_get_instance_private (skeleton);
#else
  skeleton->priv = G_TYPE_INSTANCE_GET_PRIVATE (skeleton, TYPE_GREETABLE_SKELETON, GreetableSkeletonPrivate);
#endif

  g_mutex_init (&skeleton->priv->lock);
  skeleton->priv->context = g_main_context_ref_thread_default ();
  skeleton->priv->properties = g_new0 (GValue, 1);
  g_value_init (&skeleton->priv->properties[0], G_TYPE_STRING);
}